

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3PagerUnrefPageOne(DbPage *pPg)

{
  Pager *pPager;
  
  sqlite3PcacheRelease((PgHdr *)0x16a960);
  pagerUnlockIfUnused((Pager *)0x16a96a);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3PagerUnrefPageOne(DbPage *pPg){
  Pager *pPager;
  assert( pPg!=0 );
  assert( pPg->pgno==1 );
  assert( (pPg->flags & PGHDR_MMAP)==0 ); /* Page1 is never memory mapped */
  pPager = pPg->pPager;
  sqlite3PcacheRelease(pPg);
  pagerUnlockIfUnused(pPager);
}